

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
pstore::small_vector<int,_1UL>::switch_to_big(small_vector<int,_1UL> *this,size_t new_elements)

{
  int *__first;
  int *piVar1;
  size_t sVar2;
  back_insert_iterator<std::vector<int,_std::allocator<int>_>_> __result;
  size_t new_elements_local;
  small_vector<int,_1UL> *this_local;
  
  std::vector<int,_std::allocator<int>_>::clear(&this->big_buffer_);
  std::vector<int,_std::allocator<int>_>::reserve(&this->big_buffer_,new_elements);
  __first = this->buffer_;
  piVar1 = this->buffer_;
  sVar2 = this->elements_;
  __result = std::back_inserter<std::vector<int,std::allocator<int>>>(&this->big_buffer_);
  std::copy<int*,std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
            (__first,piVar1 + sVar2,__result);
  set_buffer_ptr(this,new_elements);
  return;
}

Assistant:

void small_vector<ElementType, BodyElements>::switch_to_big (std::size_t new_elements) {
        big_buffer_.clear ();
        big_buffer_.reserve (new_elements);
        std::copy (buffer_, buffer_ + elements_, std::back_inserter (big_buffer_));
        this->set_buffer_ptr (new_elements);
    }